

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

int xSAT_SolverClaCalcLBD(xSAT_Solver_t *s,xSAT_Clause_t *pCla)

{
  Vec_Int_t *p;
  int iVar1;
  uint uVar2;
  int local_20;
  int Level;
  int nLBD;
  int i;
  xSAT_Clause_t *pCla_local;
  xSAT_Solver_t *s_local;
  
  local_20 = 0;
  s->nStamp = s->nStamp + 1;
  for (Level = 0; Level < pCla->nSize; Level = Level + 1) {
    p = s->vLevels;
    iVar1 = xSAT_Lit2Var(*(int *)(&pCla[1].field_0x0 + (long)Level * 4));
    iVar1 = Vec_IntEntry(p,iVar1);
    uVar2 = Vec_IntEntry(s->vStamp,iVar1);
    if (uVar2 != s->nStamp) {
      Vec_IntWriteEntry(s->vStamp,iVar1,s->nStamp);
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

static inline int xSAT_SolverClaCalcLBD( xSAT_Solver_t * s, xSAT_Clause_t * pCla )
{
    int i;
    int nLBD = 0;

    s->nStamp++;
    for ( i = 0; i < pCla->nSize; i++ )
    {
        int Level = Vec_IntEntry( s->vLevels, xSAT_Lit2Var( pCla->pData[i].Lit ) );
        if ( ( unsigned ) Vec_IntEntry( s->vStamp, Level ) != s->nStamp )
        {
            Vec_IntWriteEntry( s->vStamp, Level, ( int ) s->nStamp );
            nLBD++;
        }
    }
    return nLBD;
}